

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O0

_binbuf * text_client_getbuf(t_text_client *x)

{
  int iVar1;
  t_symbol *local_48;
  t_symbol *arraytype;
  int type;
  int onset;
  t_word *vec;
  t_gstub *gs;
  t_template *template;
  t_textbuf *y;
  t_text_client *x_local;
  
  y = (t_textbuf *)x;
  if (x->tc_sym == (t_symbol *)0x0) {
    if (x->tc_struct == (t_symbol *)0x0) {
      x_local = (t_text_client *)0x0;
    }
    else {
      gs = (t_gstub *)template_findbyname(x->tc_struct);
      vec = (t_word *)y->b_sym;
      if ((t_template *)gs == (t_template *)0x0) {
        pd_error(y,"text: couldn\'t find struct %s",(y[1].b_ob.te_g.g_pd)->c_name);
        x_local = (t_text_client *)0x0;
      }
      else {
        iVar1 = gpointer_check((t_gpointer *)&y->b_canvas,0);
        if (iVar1 == 0) {
          pd_error(y,"text: stale or empty pointer");
          x_local = (t_text_client *)0x0;
        }
        else {
          if (vec[1].w_index == 2) {
            _type = y->b_canvas;
          }
          else {
            _type = (_glist *)&(y->b_canvas->gl_obj).te_outlet;
          }
          iVar1 = template_find_field((t_template *)gs,(t_symbol *)y[1].b_ob.te_g.g_next,
                                      (int *)((long)&arraytype + 4),(int *)&arraytype,&local_48);
          if (iVar1 == 0) {
            pd_error(y,"text: no field named %s",(y[1].b_ob.te_g.g_next)->g_pd);
            x_local = (t_text_client *)0x0;
          }
          else if ((int)arraytype == 2) {
            x_local = *(t_text_client **)((long)&(_type->gl_obj).te_g.g_pd + (long)arraytype._4_4_);
          }
          else {
            pd_error(y,"text: field %s not of type text",(y[1].b_ob.te_g.g_next)->g_pd);
            x_local = (t_text_client *)0x0;
          }
        }
      }
    }
  }
  else {
    template = (t_template *)pd_findbyclass(x->tc_sym,text_define_class);
    if (template == (t_template *)0x0) {
      pd_error(y,"text: couldn\'t find text buffer \'%s\'",*(undefined8 *)y->b_binbuf);
      x_local = (t_text_client *)0x0;
    }
    else {
      x_local = (t_text_client *)template[1].t_pdobj;
    }
  }
  return (_binbuf *)x_local;
}

Assistant:

static t_binbuf *text_client_getbuf(t_text_client *x)
{
    if (x->tc_sym)       /* named text object */
    {
        t_textbuf *y = (t_textbuf *)pd_findbyclass(x->tc_sym,
            text_define_class);
        if (y)
            return (y->b_binbuf);
        else
        {
            pd_error(x, "text: couldn't find text buffer '%s'",
                x->tc_sym->s_name);
            return (0);
        }
    }
    else if (x->tc_struct)   /* by pointer */
    {
        t_template *template = template_findbyname(x->tc_struct);
        t_gstub *gs = x->tc_gp.gp_stub;
        t_word *vec;
        int onset, type;
        t_symbol *arraytype;
        if (!template)
        {
            pd_error(x, "text: couldn't find struct %s", x->tc_struct->s_name);
            return (0);
        }
        if (!gpointer_check(&x->tc_gp, 0))
        {
            pd_error(x, "text: stale or empty pointer");
            return (0);
        }
        if (gs->gs_which == GP_ARRAY)
            vec = x->tc_gp.gp_un.gp_w;
        else vec = x->tc_gp.gp_un.gp_scalar->sc_vec;

        if (!template_find_field(template,
            x->tc_field, &onset, &type, &arraytype))
        {
            pd_error(x, "text: no field named %s", x->tc_field->s_name);
            return (0);
        }
        if (type != DT_TEXT)
        {
            pd_error(x, "text: field %s not of type text", x->tc_field->s_name);
            return (0);
        }
        return (*(t_binbuf **)(((char *)vec) + onset));
    }
    else return (0);    /* shouldn't happen */
}